

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::internal::TrackRegistry::UpdateTrackImpl
          (TrackRegistry *this,Track track,
          function<void_(perfetto::protos::pbzero::TrackDescriptor_*)> *fill_function)

{
  string serialized_desc;
  HeapBuffered<perfetto::protos::pbzero::TrackDescriptor> new_descriptor;
  string local_100;
  HeapBuffered<perfetto::protos::pbzero::TrackDescriptor> local_e0;
  
  protozero::HeapBuffered<perfetto::protos::pbzero::TrackDescriptor>::HeapBuffered
            (&local_e0,0x20,0x1000);
  local_100._M_dataplus._M_p = (pointer)&local_e0.msg_;
  if (*(long *)(fill_function + 0x10) != 0) {
    (**(code **)(fill_function + 0x18))(fill_function,&local_100);
    protozero::HeapBuffered<perfetto::protos::pbzero::TrackDescriptor>::SerializeAsString_abi_cxx11_
              (&local_100,&local_e0);
    UpdateTrack(this,track,&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    protozero::MessageArena::~MessageArena(&local_e0.msg_.root_arena_);
    protozero::ScatteredStreamWriter::~ScatteredStreamWriter(&local_e0.writer_);
    protozero::ScatteredHeapBuffer::~ScatteredHeapBuffer(&local_e0.shb_);
    return;
  }
  ::std::__throw_bad_function_call();
}

Assistant:

void TrackRegistry::UpdateTrackImpl(
    Track track,
    std::function<void(protos::pbzero::TrackDescriptor*)> fill_function) {
  constexpr size_t kInitialSliceSize = 32;
  constexpr size_t kMaximumSliceSize = 4096;
  protozero::HeapBuffered<protos::pbzero::TrackDescriptor> new_descriptor(
      kInitialSliceSize, kMaximumSliceSize);
  fill_function(new_descriptor.get());
  auto serialized_desc = new_descriptor.SerializeAsString();
  UpdateTrack(track, serialized_desc);
}